

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::IsDefinitionSet(cmMakefile *this,string *name)

{
  Internals *this_00;
  cmState *this_01;
  cmVariableWatch *this_02;
  cmVariableWatch *vv;
  char *def;
  string *name_local;
  cmMakefile *this_local;
  
  this_00 = cmsys::auto_ptr<cmMakefile::Internals>::operator->(&this->Internal);
  vv = (cmVariableWatch *)Internals::GetDefinition(this_00,name);
  if (vv == (cmVariableWatch *)0x0) {
    this_01 = GetState(this);
    vv = (cmVariableWatch *)cmState::GetInitializedCacheValue(this_01,name);
  }
  this_02 = GetVariableWatch(this);
  if ((this_02 != (cmVariableWatch *)0x0) && (vv == (cmVariableWatch *)0x0)) {
    cmVariableWatch::VariableAccessed(this_02,name,2,(char *)0x0,this);
  }
  return (bool)(-(vv != (cmVariableWatch *)0x0) & 1);
}

Assistant:

bool cmMakefile::IsDefinitionSet(const std::string& name) const
{
  const char* def = this->Internal->GetDefinition(name);
  if(!def)
    {
    def = this->GetState()->GetInitializedCacheValue(name);
    }
#ifdef CMAKE_BUILD_WITH_CMAKE
  if(cmVariableWatch* vv = this->GetVariableWatch())
    {
    if(!def)
      {
      vv->VariableAccessed
        (name, cmVariableWatch::UNKNOWN_VARIABLE_DEFINED_ACCESS,
         def, this);
      }
    }
#endif
  return def?true:false;
}